

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

vertex_t __thiscall
Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::
get_max_vertex(Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *this,
              simplex_t idx,dimension_t k,vertex_t param_3)

{
  byte bVar1;
  logic_error *this_00;
  char in_CL;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  undefined7 in_register_00000031;
  
  if ('\0' < in_CL) {
    uVar3 = (uint)(byte)(in_CL - 1) * this->bits_per_vertex;
    bVar2 = (byte)uVar3;
    bVar1 = bVar2 & 0x3f;
    uVar4 = (uint)(CONCAT44(in_register_00000014,param_3) >> (bVar2 & 0x3f));
    if ((uVar3 & 0x40) == 0) {
      uVar4 = (uint)(CONCAT71(in_register_00000031,k) >> bVar1) | param_3 << 0x40 - bVar1;
    }
    return uVar4;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

vertex_t get_max_vertex(const simplex_t idx, dimension_t k, const vertex_t) const {
      GUDHI_assert(k > 0);
      --k;
#ifdef USE_N_MINUS_K
      return static_cast<vertex_t>(idx >> (bits_per_vertex * k)) + k;
#else
      return static_cast<vertex_t>(idx >> (bits_per_vertex * k));
#endif
    }